

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O0

RK_U32 mpp_mem_total_now(void)

{
  RK_U32 RVar1;
  undefined1 local_20 [8];
  AutoMutex auto_lock;
  MppMemService *srv;
  
  auto_lock.mLock = (Mutex *)MppMemService::get_inst();
  Mutex::Autolock::Autolock((Autolock *)local_20,((MppMemService *)auto_lock.mLock)->m_lock,1);
  RVar1 = MppMemService::total_now((MppMemService *)auto_lock.mLock);
  Mutex::Autolock::~Autolock((Autolock *)local_20);
  return RVar1;
}

Assistant:

RK_U32 mpp_mem_total_now()
{
    MppMemService *srv = MppMemService::get_inst();
    AutoMutex auto_lock(srv->m_lock);

    return srv->total_now();
}